

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

bool __thiscall re2::Compiler::IsCachedRuneByteSuffix(Compiler *this,int id)

{
  bool bVar1;
  int iVar2;
  _Self local_38;
  _Self local_30;
  uint64 local_28;
  uint64 key;
  byte local_17;
  uint8 local_16;
  uint8 local_15;
  int next;
  bool foldcase;
  uint8 hi;
  uint8 lo;
  Compiler *pCStack_10;
  int id_local;
  Compiler *this_local;
  
  local_15 = this->inst_[id].field_1.field_3.lo_;
  local_16 = this->inst_[id].field_1.field_3.hi_;
  next = id;
  pCStack_10 = this;
  iVar2 = Prog::Inst::foldcase(this->inst_ + id);
  local_17 = iVar2 != 0;
  key._4_4_ = Prog::Inst::out(this->inst_ + next);
  local_28 = MakeRuneCacheKey(local_15,local_16,(bool)(local_17 & 1),key._4_4_);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
       ::find(&this->rune_cache_,&local_28);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
       ::end(&this->rune_cache_);
  bVar1 = std::operator!=(&local_30,&local_38);
  return bVar1;
}

Assistant:

bool Compiler::IsCachedRuneByteSuffix(int id) {
  uint8 lo = inst_[id].lo_;
  uint8 hi = inst_[id].hi_;
  bool foldcase = inst_[id].foldcase() != 0;
  int next = inst_[id].out();

  uint64 key = MakeRuneCacheKey(lo, hi, foldcase, next);
  return rune_cache_.find(key) != rune_cache_.end();
}